

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void check_number(char *str_num,char **num_end,LY_DATA_TYPE base)

{
  char cVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  char *pcVar4;
  
  ppuVar3 = __ctype_b_loc();
  puVar2 = *ppuVar3;
  cVar1 = *str_num;
  if ((puVar2[cVar1] >> 0xb & 1) == 0) {
    if ((cVar1 != '+') && (cVar1 != '-')) goto LAB_00123267;
LAB_00123231:
    str_num = str_num + 1;
  }
  else if ((cVar1 == '-') || (cVar1 == '+')) goto LAB_00123231;
  str_num = str_num + -1;
  do {
    pcVar4 = str_num;
    str_num = pcVar4 + 1;
  } while ((*(byte *)((long)puVar2 + (long)pcVar4[1] * 2 + 1) & 8) != 0);
  if ((base == LY_TYPE_DEC64) && (pcVar4[1] == '.')) {
    cVar1 = pcVar4[2];
    while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 8) != 0) {
      cVar1 = str_num[1];
      str_num = str_num + 1;
    }
  }
LAB_00123267:
  *num_end = str_num;
  return;
}

Assistant:

static void
check_number(const char *str_num, const char **num_end, LY_DATA_TYPE base)
{
    if (!isdigit(str_num[0]) && (str_num[0] != '-') && (str_num[0] != '+')) {
        *num_end = str_num;
        return;
    }

    if ((str_num[0] == '-') || (str_num[0] == '+')) {
        ++str_num;
    }

    while (isdigit(str_num[0])) {
        ++str_num;
    }

    if ((base != LY_TYPE_DEC64) || (str_num[0] != '.') || !isdigit(str_num[1])) {
        *num_end = str_num;
        return;
    }

    ++str_num;
    while (isdigit(str_num[0])) {
        ++str_num;
    }

    *num_end = str_num;
}